

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::PrintTo(double d,ostream *os)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  
  lVar1 = *(long *)(*(long *)os + -0x18);
  uVar2 = *(undefined8 *)(os + lVar1 + 8);
  iVar3 = AppropriateResolution<double>(d);
  *(long *)(os + lVar1 + 8) = (long)iVar3;
  std::ostream::_M_insert<double>(d);
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = uVar2;
  return;
}

Assistant:

inline void PrintTo(double d, ::std::ostream* os) {
  auto old_precision = os->precision();
  os->precision(AppropriateResolution(d));
  *os << d;
  os->precision(old_precision);
}